

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disassembler.cpp
# Opt level: O0

void __thiscall LLVMBC::StreamState::append(StreamState *this,ExtractElementInst *extr,bool decl)

{
  uint64_t local_48;
  Value *local_40;
  Value *local_38;
  Type *local_30;
  uint64_t local_28;
  undefined1 local_19;
  ExtractElementInst *pEStack_18;
  bool decl_local;
  ExtractElementInst *extr_local;
  StreamState *this_local;
  
  local_19 = decl;
  pEStack_18 = extr;
  extr_local = (ExtractElementInst *)this;
  if (decl) {
    local_28 = Value::get_tween_id((Value *)extr);
    local_30 = Value::getType((Value *)pEStack_18);
    local_38 = ExtractElementInst::getVectorOperand(pEStack_18);
    local_40 = ExtractElementInst::getIndexOperand(pEStack_18);
    append<char_const(&)[2],unsigned_long,char_const(&)[19],LLVMBC::Type*,char_const(&)[2],LLVMBC::Value*,char_const(&)[3],LLVMBC::Value*>
              (this,(char (*) [2])0x2a90be,&local_28,(char (*) [19])" = extractelement ",&local_30,
               (char (*) [2])0x2a8f72,&local_38,(char (*) [3])", ",&local_40);
  }
  else {
    local_48 = Value::get_tween_id((Value *)extr);
    append<char_const(&)[2],unsigned_long>(this,(char (*) [2])0x2a90be,&local_48);
  }
  return;
}

Assistant:

void StreamState::append(ExtractElementInst *extr, bool decl)
{
	if (decl)
	{
		append("%", extr->get_tween_id(), " = extractelement ",
		       extr->getType(), " ", extr->getVectorOperand(), ", ", extr->getIndexOperand());
	}
	else
		append("%", extr->get_tween_id());
}